

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void recmult(double *A,double *B,double *C,int m,int n,int p,int sA,int sB,int sC)

{
  int iVar1;
  double dVar2;
  int t;
  int v;
  int u;
  int k;
  int j;
  int i;
  int p2;
  int n2;
  int m2;
  int p_local;
  int n_local;
  int m_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  if (m + n + p < 0xc1) {
    for (k = 0; k < m; k = k + 1) {
      for (u = 0; u < p; u = u + 1) {
        iVar1 = u + k * sC;
        for (v = 0; v < n; v = v + 1) {
          C[iVar1] = A[v + k * sB] * B[u + v * sC] + C[iVar1];
        }
      }
    }
  }
  else if ((m < n) || (m < p)) {
    if ((n < m) || (n < p)) {
      if ((m <= p) && (n <= p)) {
        dVar2 = ceil((double)p / 2.0);
        iVar1 = (int)dVar2;
        recmult(A,B,C,m,n,iVar1,sA,sB,sC);
        recmult(A,B + iVar1,C + iVar1,m,n,p - iVar1,sA,sB,sC);
      }
    }
    else {
      dVar2 = ceil((double)n / 2.0);
      iVar1 = (int)dVar2;
      recmult(A,B,C,m,iVar1,p,sA,sB,sC);
      recmult(A + iVar1,B + iVar1 * sC,C,m,n - iVar1,p,sA,sB,sC);
    }
  }
  else {
    dVar2 = ceil((double)m / 2.0);
    iVar1 = (int)dVar2;
    recmult(A,B,C,iVar1,n,p,sA,sB,sC);
    recmult(A + iVar1 * sB,B,C + iVar1 * sC,m - iVar1,n,p,sA,sB,sC);
  }
  return;
}

Assistant:

void recmult(double* A, double* B, double* C,int m,int n, int p,int sA,int sB, int sC) {
	int m2,n2,p2;
	register int i,j,k;
	int u,v,t;
	if (m + n + p <= CUTOFF) {
		//#pragma omp parallel for private(i,j,k,v,u,t)
		for (i = 0; i < m; ++i) {
			for (j = 0; j < p; ++j) {
				v = i * sB;
				u = i * sC;
				t = j + u;
				for (k = 0; k < n;++k) {
					C[t] += A[k + v] * B[j + k * sC];
				}
			}
		}

		
	} else if (m >= n && m >= p) {
		m2 = (int) ceil((double) m / 2.0);
		recmult(A,B,C,m2,n,p,sA,sB,sC);
		recmult(A + m2*sB,B,C + m2*sC,m-m2,n,p,sA,sB,sC);
		
	} else if (n >= m && n >= p) {
		n2 = (int) ceil((double) n / 2.0);
		recmult(A,B,C,m,n2,p,sA,sB,sC);
		recmult(A+n2,B+n2*sC,C,m,n-n2,p,sA,sB,sC);
		
	} else if (p >= m && p >= n) {
		p2 = (int) ceil((double) p / 2.0);
		recmult(A,B,C,m,n,p2,sA,sB,sC);
		recmult(A,B+p2,C+p2,m,n,p-p2,sA,sB,sC);
	}
}